

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

char_int_type __thiscall
nlohmann::json_abi_v3_11_2::detail::
lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
::get(lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
      *this)

{
  size_t *psVar1;
  pointer *ppcVar2;
  int iVar3;
  byte *pbVar4;
  iterator __position;
  uint uVar5;
  char local_9;
  
  (this->position).chars_read_total = (this->position).chars_read_total + 1;
  psVar1 = &(this->position).chars_read_current_line;
  *psVar1 = *psVar1 + 1;
  if (this->next_unget == true) {
    this->next_unget = false;
  }
  else {
    pbVar4 = (byte *)(this->ia).current;
    if (pbVar4 == (byte *)(this->ia).end) {
      uVar5 = 0xffffffff;
    }
    else {
      uVar5 = (uint)*pbVar4;
      (this->ia).current = (char *)(pbVar4 + 1);
    }
    this->current = uVar5;
  }
  if (this->current != -1) {
    local_9 = (char)this->current;
    __position._M_current =
         (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (&this->token_string,__position,&local_9);
    }
    else {
      *__position._M_current = local_9;
      ppcVar2 = &(this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar2 = *ppcVar2 + 1;
    }
  }
  iVar3 = this->current;
  if (iVar3 == 10) {
    psVar1 = &(this->position).lines_read;
    *psVar1 = *psVar1 + 1;
    (this->position).chars_read_current_line = 0;
  }
  return iVar3;
}

Assistant:

char_int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia.get_character();
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            token_string.push_back(std::char_traits<char_type>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }